

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<SubArray,Macro>::emplace_helper<Macro_const&>
          (QHash<SubArray,_Macro> *this,SubArray *key,Macro *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<SubArray,_Macro> *in_RDX;
  Data<QHashPrivate::Node<SubArray,_Macro>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Macro *in_stack_ffffffffffffff90;
  SubArray *in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::findOrInsert<SubArray>
            (in_RSI,&in_RDX->key);
  QHashPrivate::iterator<QHashPrivate::Node<SubArray,_Macro>_>::node
            ((iterator<QHashPrivate::Node<SubArray,_Macro>_> *)in_RDX);
  QHashPrivate::Node<SubArray,Macro>::createInPlace<Macro_const&>
            (in_RDX,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  it.bucket = (size_t)in_stack_ffffffffffffff98;
  it.d = (Data<QHashPrivate::Node<SubArray,_Macro>_> *)in_stack_ffffffffffffff90;
  QHash<SubArray,_Macro>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }